

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObject.cpp
# Opt level: O0

void __thiscall GameObject::ConsumeItem(GameObject *this)

{
  ObjectType OVar1;
  GameObject *this_local;
  
  OVar1 = getType(this);
  if (OVar1 != objectPlayer) {
    getType(this);
  }
  return;
}

Assistant:

void GameObject::ConsumeItem() { 
  //if object is player, reduce speed multiplier and consume item
  if(this->getType() == ObjectType::objectPlayer)
  {
    //todo: reduce game speed multiplier and consume item
  }
  //else if object is npc, just consume item
  else if(this->getType() == ObjectType::objectPerson)
  {
    //todo:  consume item
  }

  //else nothing happens

 }